

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans.h
# Opt level: O2

void __thiscall draco::RAnsEncoder<16>::rans_write(RAnsEncoder<16> *this,rans_sym *sym)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = sym->prob;
  uVar3 = (this->ans_).state;
  while (uVar1 << 10 <= uVar3) {
    iVar2 = (this->ans_).buf_offset;
    (this->ans_).buf_offset = iVar2 + 1;
    (this->ans_).buf[iVar2] = (uint8_t)uVar3;
    uVar3 = (this->ans_).state >> 8;
    (this->ans_).state = uVar3;
  }
  (this->ans_).state = (uVar3 / uVar1) * 0x10000 + uVar3 % uVar1 + sym->cum_prob;
  return;
}

Assistant:

inline void rans_write(const struct rans_sym *const sym) {
    const uint32_t p = sym->prob;
    while (ans_.state >= l_rans_base / rans_precision * DRACO_ANS_IO_BASE * p) {
      ans_.buf[ans_.buf_offset++] = ans_.state % DRACO_ANS_IO_BASE;
      ans_.state /= DRACO_ANS_IO_BASE;
    }
    ans_.state =
        (ans_.state / p) * rans_precision + ans_.state % p + sym->cum_prob;
  }